

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginPopupModal(char *name,bool *p_open,ImGuiWindowFlags flags)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiID id;
  ImGuiViewport *pIVar5;
  undefined1 auVar6 [16];
  
  pIVar2 = GImGui;
  id = ImGuiWindow::GetID(GImGui->CurrentWindow,name,(char *)0x0);
  bVar4 = IsPopupOpen(id,0);
  if (bVar4) {
    if (((pIVar2->NextWindowData).Flags & 1) == 0) {
      pIVar5 = GetMainViewport();
      pIVar3 = GImGui;
      auVar6._0_4_ = (pIVar5->Size).x * 0.5 + (pIVar5->Pos).x;
      auVar6._4_4_ = (pIVar5->Size).y * 0.5 + (pIVar5->Pos).y;
      auVar6._8_8_ = 0;
      (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
      IVar1 = (ImVec2)vmovlps_avx(auVar6);
      (pIVar3->NextWindowData).PosVal = IVar1;
      (pIVar3->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar3->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar3->NextWindowData).PosCond = 4;
    }
    bVar4 = Begin(name,p_open,flags | 0xc000020);
    if (bVar4) {
      if (p_open == (bool *)0x0) {
        return true;
      }
      if (*p_open != false) {
        return true;
      }
      EndPopup();
      ClosePopupToLevel((pIVar2->BeginPopupStack).Size,true);
    }
    else {
      EndPopup();
    }
  }
  else {
    (pIVar2->NextWindowData).Flags = 0;
  }
  return false;
}

Assistant:

bool ImGui::BeginPopupModal(const char* name, bool* p_open, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(name);
    if (!IsPopupOpen(id, ImGuiPopupFlags_None))
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }

    // Center modal windows by default for increased visibility
    // (this won't really last as settings will kick in, and is mostly for backward compatibility. user may do the same themselves)
    // FIXME: Should test for (PosCond & window->SetWindowPosAllowFlags) with the upcoming window.
    if ((g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) == 0)
    {
        const ImGuiViewport* viewport = GetMainViewport();
        SetNextWindowPos(viewport->GetCenter(), ImGuiCond_FirstUseEver, ImVec2(0.5f, 0.5f));
    }

    flags |= ImGuiWindowFlags_Popup | ImGuiWindowFlags_Modal | ImGuiWindowFlags_NoCollapse;
    const bool is_open = Begin(name, p_open, flags);
    if (!is_open || (p_open && !*p_open)) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    {
        EndPopup();
        if (is_open)
            ClosePopupToLevel(g.BeginPopupStack.Size, true);
        return false;
    }
    return is_open;
}